

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O0

bool __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::CrossingParity
          (DegeneracyFinder *this,VertexId v0,VertexId v1,bool include_same)

{
  byte bVar1;
  bool bVar2;
  S2Point *pSVar3;
  EdgeId *pEVar4;
  Edge *pEVar5;
  int local_cc;
  Edge edge_1;
  EdgeId e;
  EdgeId *__end2_1;
  EdgeId *__begin2_1;
  VertexInEdgeIds *local_a0;
  VertexInEdgeIds *__range2_1;
  Edge *edge;
  Edge *__end2;
  Edge *__begin2;
  VertexOutEdges *local_70;
  VertexOutEdges *__range2;
  S2Point p0_ref;
  S2Point p1;
  S2Point p0;
  int crossings;
  bool include_same_local;
  VertexId v1_local;
  VertexId v0_local;
  DegeneracyFinder *this_local;
  
  bVar1 = 0;
  pSVar3 = S2Builder::Graph::vertex(this->g_,v0);
  p1.c_[2] = pSVar3->c_[0];
  pSVar3 = S2Builder::Graph::vertex(this->g_,v1);
  p0_ref.c_[2] = pSVar3->c_[0];
  p1.c_[0] = pSVar3->c_[1];
  p1.c_[1] = pSVar3->c_[2];
  S2::Ortho((S2Point *)&__range2,(S2Point *)(p1.c_ + 2));
  ___begin2 = S2Builder::Graph::VertexOutMap::edges(&this->out_,v0);
  local_70 = (VertexOutEdges *)&__begin2;
  __end2 = S2Builder::Graph::VertexOutEdges::begin(local_70);
  edge = S2Builder::Graph::VertexOutEdges::end(local_70);
  for (; __end2 != edge; __end2 = __end2 + 1) {
    __range2_1 = (VertexInEdgeIds *)__end2;
    if (__end2->second == v1) {
      if (include_same) {
        bVar1 = bVar1 + 1;
      }
    }
    else {
      pSVar3 = S2Builder::Graph::vertex(this->g_,__end2->second);
      bVar2 = s2pred::OrderedCCW((S2Point *)&__range2,pSVar3,(S2Point *)(p0_ref.c_ + 2),
                                 (S2Point *)(p1.c_ + 2));
      if (bVar2) {
        bVar1 = bVar1 + 1;
      }
    }
  }
  ___begin2_1 = S2Builder::Graph::VertexInMap::edge_ids(&this->in_,v0);
  local_a0 = (VertexInEdgeIds *)&__begin2_1;
  __end2_1 = S2Builder::Graph::VertexInEdgeIds::begin(local_a0);
  pEVar4 = S2Builder::Graph::VertexInEdgeIds::end(local_a0);
  for (; __end2_1 != pEVar4; __end2_1 = __end2_1 + 1) {
    pEVar5 = S2Builder::Graph::edge(this->g_,*__end2_1);
    local_cc = (*pEVar5).first;
    if (local_cc == v1) {
      if (include_same) {
        bVar1 = bVar1 + 1;
      }
    }
    else {
      pSVar3 = S2Builder::Graph::vertex(this->g_,local_cc);
      bVar2 = s2pred::OrderedCCW((S2Point *)&__range2,pSVar3,(S2Point *)(p0_ref.c_ + 2),
                                 (S2Point *)(p1.c_ + 2));
      if (bVar2) {
        bVar1 = bVar1 + 1;
      }
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool DegeneracyFinder::CrossingParity(VertexId v0, VertexId v1,
                                      bool include_same) const {
  int crossings = 0;
  S2Point p0 = g_.vertex(v0);
  S2Point p1 = g_.vertex(v1);
  S2Point p0_ref = S2::Ortho(p0);
  for (const Edge& edge : out_.edges(v0)) {
    if (edge.second == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.second), p1, p0)) {
      ++crossings;
    }
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    Edge edge = g_.edge(e);
    if (edge.first == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.first), p1, p0)) {
      ++crossings;
    }
  }
  return crossings & 1;
}